

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hiero_console.cpp
# Opt level: O0

int main(void)

{
  bool bVar1;
  istream *piVar2;
  reference rule_00;
  ostream *poVar3;
  vector<jhu::thrax::SpanPair,_std::allocator<jhu::thrax::SpanPair>_> *in_RCX;
  string_view line_00;
  undefined1 auVar4 [16];
  PhrasalRule *rule;
  iterator __end2;
  iterator __begin2;
  vector<jhu::thrax::PhrasalRule,_std::allocator<jhu::thrax::PhrasalRule>_> *__range2;
  vector<jhu::thrax::SpanPair,_std::allocator<jhu::thrax::SpanPair>_> initial;
  undefined1 local_90 [8];
  AlignedSentencePair asp;
  Labeler local_38;
  HieroLabeler hiero;
  string line;
  
  std::__cxx11::string::string((string *)&hiero);
  memset(&local_38,0,8);
  jhu::thrax::HieroLabeler::HieroLabeler((HieroLabeler *)&local_38);
  while( true ) {
    piVar2 = std::getline<char,std::char_traits<char>,std::allocator<char>>
                       ((istream *)&std::cin,(string *)&hiero);
    bVar1 = std::ios::operator_cast_to_bool((ios *)(piVar2 + *(long *)(*(long *)piVar2 + -0x18)));
    if (!bVar1) break;
    auVar4 = std::__cxx11::string::operator_cast_to_basic_string_view((string *)&hiero);
    line_00._M_len = auVar4._8_8_;
    initial.super__Vector_base<jhu::thrax::SpanPair,_std::allocator<jhu::thrax::SpanPair>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = auVar4._0_8_;
    line_00._M_str = (char *)in_RCX;
    jhu::thrax::readAlignedSentencePair<false,false>
              ((AlignedSentencePair *)local_90,
               (thrax *)initial.
                        super__Vector_base<jhu::thrax::SpanPair,_std::allocator<jhu::thrax::SpanPair>_>
                        ._M_impl.super__Vector_impl_data._M_end_of_storage,line_00);
    jhu::thrax::minimalConsistentPairs
              ((vector<jhu::thrax::SpanPair,_std::allocator<jhu::thrax::SpanPair>_> *)&__range2,
               (Alignment *)
               &asp.tgt.
                super__Vector_base<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage,10);
    in_RCX = (vector<jhu::thrax::SpanPair,_std::allocator<jhu::thrax::SpanPair>_> *)&__range2;
    jhu::thrax::extract((vector<jhu::thrax::PhrasalRule,_std::allocator<jhu::thrax::PhrasalRule>_> *
                        )&__begin2,&local_38,(AlignedSentencePair *)local_90,in_RCX);
    __end2 = std::vector<jhu::thrax::PhrasalRule,_std::allocator<jhu::thrax::PhrasalRule>_>::begin
                       ((vector<jhu::thrax::PhrasalRule,_std::allocator<jhu::thrax::PhrasalRule>_> *
                        )&__begin2);
    rule = (PhrasalRule *)
           std::vector<jhu::thrax::PhrasalRule,_std::allocator<jhu::thrax::PhrasalRule>_>::end
                     ((vector<jhu::thrax::PhrasalRule,_std::allocator<jhu::thrax::PhrasalRule>_> *)
                      &__begin2);
    while( true ) {
      bVar1 = __gnu_cxx::operator!=
                        (&__end2,(__normal_iterator<jhu::thrax::PhrasalRule_*,_std::vector<jhu::thrax::PhrasalRule,_std::allocator<jhu::thrax::PhrasalRule>_>_>
                                  *)&rule);
      if (!bVar1) break;
      rule_00 = __gnu_cxx::
                __normal_iterator<jhu::thrax::PhrasalRule_*,_std::vector<jhu::thrax::PhrasalRule,_std::allocator<jhu::thrax::PhrasalRule>_>_>
                ::operator*(&__end2);
      poVar3 = jhu::thrax::operator<<((ostream *)&std::cout,rule_00);
      std::operator<<(poVar3,'\n');
      __gnu_cxx::
      __normal_iterator<jhu::thrax::PhrasalRule_*,_std::vector<jhu::thrax::PhrasalRule,_std::allocator<jhu::thrax::PhrasalRule>_>_>
      ::operator++(&__end2);
    }
    std::vector<jhu::thrax::PhrasalRule,_std::allocator<jhu::thrax::PhrasalRule>_>::~vector
              ((vector<jhu::thrax::PhrasalRule,_std::allocator<jhu::thrax::PhrasalRule>_> *)
               &__begin2);
    std::vector<jhu::thrax::SpanPair,_std::allocator<jhu::thrax::SpanPair>_>::~vector
              ((vector<jhu::thrax::SpanPair,_std::allocator<jhu::thrax::SpanPair>_> *)&__range2);
    jhu::thrax::AlignedSentencePair::~AlignedSentencePair((AlignedSentencePair *)local_90);
  }
  jhu::thrax::HieroLabeler::~HieroLabeler((HieroLabeler *)&local_38);
  std::__cxx11::string::~string((string *)&hiero);
  return 0;
}

Assistant:

int main() {
  std::string line;
  jhu::thrax::HieroLabeler hiero{};
  while (std::getline(std::cin, line)) {
    auto asp = jhu::thrax::readAlignedSentencePair<false, false>(line);
    auto initial = jhu::thrax::minimalConsistentPairs(asp.alignment, 10);
    for (const auto& rule : jhu::thrax::extract(hiero, asp, initial)) {
      std::cout << rule << '\n';
    }
  }
}